

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  initializer_list<std::pair<BigNum,_BigNum>_> __l;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_00;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_01;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_02;
  allocator_type local_a39;
  BigNum b;
  BigNum c;
  BigNum local_9f8;
  BigNum a;
  pair<BigNum,_BigNum> local_9b8 [3];
  BigNum local_8f8;
  BigNum local_8d8;
  BigNum local_8b8;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test2;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test1;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test4;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_840;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_828;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_810;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_7f8;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test;
  BigNum local_7c8;
  BigNum local_7a8;
  BigNum local_788;
  BigNum local_768;
  BigNum local_748;
  string local_728;
  string local_708;
  BigNum local_6e8;
  BigNum local_6c8;
  BigNum local_6a8;
  BigNum local_688;
  BigNum local_668;
  string local_648;
  string local_628;
  BigNum local_608;
  BigNum local_5e8;
  BigNum local_5c8;
  BigNum local_5a8;
  BigNum local_588;
  string local_568;
  string local_548;
  BigNum local_528;
  BigNum local_508;
  BigNum local_4e8;
  BigNum local_4c8;
  BigNum local_4a8;
  string local_488;
  string local_468;
  BigNum local_448;
  BigNum local_428;
  BigNum local_408;
  BigNum local_3e8;
  BigNum local_3c8;
  string local_3a8;
  string local_388;
  BigNum local_368;
  BigNum local_348;
  BigNum local_328;
  BigNum local_308;
  BigNum local_2e8;
  BigNum local_2c8;
  BigNum local_2a8;
  BigNum local_288;
  BigNum local_268;
  BigNum local_248;
  BigNum local_228;
  BigNum local_208;
  BigNum local_1e8;
  BigNum local_1c8;
  BigNum local_1a8;
  BigNum local_188;
  BigNum local_168;
  BigNum local_148;
  BigNum local_128;
  BigNum local_108;
  BigNum local_e8;
  BigNum local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"6",(allocator *)local_9b8);
  BigNum::BigNum(&a,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"2",(allocator *)local_9b8);
  BigNum::BigNum(&b,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string
            ((string *)&local_88,"1234567827483828383893828238989938389893389",
             (allocator *)local_9b8);
  BigNum::BigNum(&c,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_a8,"123456798960569059",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_a8);
  BigNum::operator=(&b,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_a8);
  BigNum::BigNum(&local_c8,&b);
  sqrt(__x);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_c8);
  std::operator<<((ostream *)&std::cout," sqrt ");
  BigNum::BigNum(&local_e8,&b);
  print(&local_e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_e8);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_108,&c);
  print(&local_108);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BigNum::BigNum(&local_9f8,2);
  BigNum::BigNum(&local_8b8,5);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(local_9b8,&local_9f8,&local_8b8);
  BigNum::BigNum(&local_8d8,3);
  BigNum::BigNum(&local_8f8,7);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(local_9b8 + 1,&local_8d8,&local_8f8);
  BigNum::BigNum((BigNum *)&test1,5);
  BigNum::BigNum((BigNum *)&test2,0xb);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>
            (local_9b8 + 2,(BigNum *)&test1,(BigNum *)&test2);
  __l._M_len = 3;
  __l._M_array = local_9b8;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&test,__l,(allocator_type *)&test4);
  lVar1 = 0x80;
  do {
    std::pair<BigNum,_BigNum>::~pair
              ((pair<BigNum,_BigNum> *)
               ((long)&local_9b8[0].first.digits.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&test2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&test1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_9f8);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_7f8,&test);
  solve_system(&local_9b8[0].first,&local_7f8);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_7f8);
  std::operator<<((ostream *)&std::cout,"Result: ");
  BigNum::BigNum(&local_128,&c);
  print(&local_128);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_128);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BigNum::BigNum(&local_9f8,5);
  BigNum::BigNum(&local_8b8,9);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(local_9b8,&local_9f8,&local_8b8);
  BigNum::BigNum(&local_8d8,7);
  BigNum::BigNum(&local_8f8,8);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(local_9b8 + 1,&local_8d8,&local_8f8);
  BigNum::BigNum((BigNum *)&test1,3);
  BigNum::BigNum((BigNum *)&test2,7);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>
            (local_9b8 + 2,(BigNum *)&test1,(BigNum *)&test2);
  __l_00._M_len = 3;
  __l_00._M_array = local_9b8;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&test4,__l_00,&local_a39);
  lVar1 = 0x80;
  do {
    std::pair<BigNum,_BigNum>::~pair
              ((pair<BigNum,_BigNum> *)
               ((long)&local_9b8[0].first.digits.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&test2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&test1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_9f8);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_810,&test4);
  solve_system(&local_9b8[0].first,&local_810);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_810);
  std::operator<<((ostream *)&std::cout,"Result: ");
  BigNum::BigNum(&local_148,&c);
  print(&local_148);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_148);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BigNum::BigNum(&local_9f8,1);
  BigNum::BigNum(&local_8b8,5);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(local_9b8,&local_9f8,&local_8b8);
  BigNum::BigNum(&local_8d8,2);
  BigNum::BigNum(&local_8f8,7);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(local_9b8 + 1,&local_8d8,&local_8f8);
  __l_01._M_len = 2;
  __l_01._M_array = local_9b8;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&test1,__l_01,(allocator_type *)&test2);
  lVar1 = 0x40;
  do {
    std::pair<BigNum,_BigNum>::~pair
              ((pair<BigNum,_BigNum> *)
               ((long)&local_9b8[0].first.digits.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_9f8);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_828,&test1);
  solve_system(&local_9b8[0].first,&local_828);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_828);
  std::operator<<((ostream *)&std::cout,"Result: ");
  BigNum::BigNum(&local_168,&c);
  print(&local_168);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_168);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BigNum::BigNum(&local_9f8,0);
  BigNum::BigNum(&local_8b8,2);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(local_9b8,&local_9f8,&local_8b8);
  BigNum::BigNum(&local_8d8,0);
  BigNum::BigNum(&local_8f8,4);
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(local_9b8 + 1,&local_8d8,&local_8f8);
  __l_02._M_len = 2;
  __l_02._M_array = local_9b8;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&test2,__l_02,&local_a39);
  lVar1 = 0x40;
  do {
    std::pair<BigNum,_BigNum>::~pair
              ((pair<BigNum,_BigNum> *)
               ((long)&local_9b8[0].first.digits.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_8b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_9f8);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_840,&test2);
  solve_system(&local_9b8[0].first,&local_840);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_840);
  std::operator<<((ostream *)&std::cout,"Result: ");
  BigNum::BigNum(&local_188,&c);
  print(&local_188);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_188);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BigNum::BigNum(&local_9b8[0].first,5);
  BigNum::operator=(&a,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  BigNum::BigNum(&local_9b8[0].first,0xd);
  BigNum::operator=(&b,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  BigNum::BigNum(&local_1a8,&a);
  BigNum::BigNum(&local_1c8,&b);
  reverseByMod(&local_9b8[0].first,&local_1a8,&local_1c8);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_1c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_1a8);
  BigNum::BigNum(&local_1e8,&a);
  print(&local_1e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_1e8);
  std::operator<<((ostream *)&std::cout,"^(-1) (mod ");
  BigNum::BigNum(&local_208,&b);
  print(&local_208);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_208);
  std::operator<<((ostream *)&std::cout,") = ");
  BigNum::BigNum(&local_228,&c);
  print(&local_228);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_228);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BigNum::BigNum(&local_9b8[0].first,5);
  BigNum::operator=(&a,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  BigNum::BigNum(&local_9b8[0].first,7);
  BigNum::operator=(&b,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  BigNum::BigNum(&local_248,&a);
  BigNum::BigNum(&local_268,&b);
  reverseByMod(&local_9b8[0].first,&local_248,&local_268);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_268);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_248);
  BigNum::BigNum(&local_288,&a);
  print(&local_288);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_288);
  std::operator<<((ostream *)&std::cout,"^(-1) (mod ");
  BigNum::BigNum(&local_2a8,&b);
  print(&local_2a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_2a8);
  std::operator<<((ostream *)&std::cout,") = ");
  BigNum::BigNum(&local_2c8,&c);
  print(&local_2c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_2c8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BigNum::BigNum(&local_9b8[0].first,0x47);
  BigNum::operator=(&a,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  BigNum::BigNum(&local_9b8[0].first,0x5b);
  BigNum::operator=(&b,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  BigNum::BigNum(&local_2e8,&a);
  BigNum::BigNum(&local_308,&b);
  reverseByMod(&local_9b8[0].first,&local_2e8,&local_308);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_308);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_2e8);
  BigNum::BigNum(&local_328,&a);
  print(&local_328);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_328);
  std::operator<<((ostream *)&std::cout,"^(-1) (mod ");
  BigNum::BigNum(&local_348,&b);
  print(&local_348);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_348);
  std::operator<<((ostream *)&std::cout,") = ");
  BigNum::BigNum(&local_368,&c);
  print(&local_368);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_368);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::string((string *)&local_388,"12",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_388);
  BigNum::operator=(&a,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::string((string *)&local_3a8,"6",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_3a8);
  BigNum::operator=(&b,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_3a8);
  BigNum::BigNum(&local_3c8,&a);
  BigNum::BigNum(&local_3e8,&b);
  operator/(&local_9b8[0].first,&local_3c8,&local_3e8);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_3e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_3c8);
  BigNum::BigNum(&local_408,&a);
  print(&local_408);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_408);
  std::operator<<((ostream *)&std::cout," / ");
  BigNum::BigNum(&local_428,&b);
  print(&local_428);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_428);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_448,&c);
  print(&local_448);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_448);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::string((string *)&local_468,"3",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_468);
  BigNum::operator=(&a,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::string((string *)&local_488,"9",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_488);
  BigNum::operator=(&b,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_488);
  BigNum::BigNum(&local_4a8,&a);
  BigNum::BigNum(&local_4c8,&b);
  pow(__x_00,in_XMM1_Qa);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_4c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_4a8);
  BigNum::BigNum(&local_4e8,&a);
  print(&local_4e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_4e8);
  std::operator<<((ostream *)&std::cout,"^");
  BigNum::BigNum(&local_508,&b);
  print(&local_508);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_508);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_528,&c);
  print(&local_528);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_528);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::string((string *)&local_548,"400",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_548);
  BigNum::operator=(&a,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::string((string *)&local_568,"9",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_568);
  BigNum::operator=(&b,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_568);
  BigNum::BigNum(&local_588,&a);
  BigNum::BigNum(&local_5a8,&b);
  operator+(&local_9b8[0].first,&local_588,&local_5a8);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_5a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_588);
  BigNum::BigNum(&local_5c8,&a);
  print(&local_5c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_5c8);
  std::operator<<((ostream *)&std::cout," + ");
  BigNum::BigNum(&local_5e8,&b);
  print(&local_5e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_5e8);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_608,&c);
  print(&local_608);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_608);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::string((string *)&local_628,"64",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_628);
  BigNum::operator=(&a,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::string((string *)&local_648,"64",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_648);
  BigNum::operator=(&b,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_648);
  BigNum::BigNum(&local_668,&a);
  BigNum::BigNum(&local_688,&b);
  operator*(&local_9b8[0].first,&local_668,&local_688);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_688);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_668);
  BigNum::BigNum(&local_6a8,&a);
  print(&local_6a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_6a8);
  std::operator<<((ostream *)&std::cout," * ");
  BigNum::BigNum(&local_6c8,&b);
  print(&local_6c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_6c8);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_6e8,&c);
  print(&local_6e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_6e8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::string((string *)&local_708,"4096",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_708);
  BigNum::operator=(&a,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::string((string *)&local_728,"4",(allocator *)&local_9f8);
  BigNum::BigNum(&local_9b8[0].first,&local_728);
  BigNum::operator=(&b,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::__cxx11::string::~string((string *)&local_728);
  BigNum::BigNum(&local_748,&a);
  BigNum::BigNum(&local_768,&b);
  operator/(&local_9b8[0].first,&local_748,&local_768);
  BigNum::operator=(&c,&local_9b8[0].first);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_9b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_768);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_748);
  BigNum::BigNum(&local_788,&a);
  print(&local_788);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_788);
  std::operator<<((ostream *)&std::cout," / ");
  BigNum::BigNum(&local_7a8,&b);
  print(&local_7a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_7a8);
  std::operator<<((ostream *)&std::cout," = ");
  BigNum::BigNum(&local_7c8,&c);
  print(&local_7c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_7c8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&test2);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&test1);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&test4);
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&test);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&c);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&b);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&a);
  return 0;
}

Assistant:

int main() {
    BigNum a = BigNum("6");
    BigNum b = BigNum("2");
    BigNum c = BigNum("1234567827483828383893828238989938389893389");

   // a = BigNum("4096");
    b = BigNum("123456798960569059");
    c =  sqrt(b);
   // print(a);
    cout << " sqrt ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    // solve_system(vector<std::pair<BigNum, BigNum>> equations)

    vector<std::pair<BigNum, BigNum>> test = {{BigNum(2), BigNum(5)},
                                              {BigNum(3), BigNum(7)},
                                              {BigNum(5), BigNum(11)}};
    c = solve_system(test);
    cout << "Result: ";
    print(c);
    cout << endl;

    vector<std::pair<BigNum, BigNum>> test4 = {{BigNum(5), BigNum(9)},
                                              {BigNum(7), BigNum(8)},
                                              {BigNum(3), BigNum(7)}};
    c = solve_system(test4);
    cout << "Result: ";
    print(c);
    cout << endl;
    vector<std::pair<BigNum, BigNum>> test1 = {{BigNum(1), BigNum(5)},
                                              {BigNum(2), BigNum(7)}};
    c = solve_system(test1);
    cout << "Result: ";
    print(c);
    cout << endl;

    vector<std::pair<BigNum, BigNum>> test2 = {{BigNum(0), BigNum(2)},
                                               {BigNum(0), BigNum(4)}};
    c = solve_system(test2);
    cout << "Result: ";
    print(c);
    cout << endl;

    a = BigNum(5);
    b = BigNum(13);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;

    a = BigNum(5);
    b = BigNum(7);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;

    a = BigNum(71);
    b = BigNum(91);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;


    a = BigNum("12");
    b = BigNum("6");
    int f = 10;
    c = a / b;
    print(a);
    cout << " / ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("3");
    b = BigNum("9");
    c = pow(a,b);
    print(a);
    cout << "^";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("400");
    b = BigNum("9");
    c = a + b;
    print(a);
    cout << " + ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;


    a = BigNum("64");
    b = BigNum("64");
    c = a * b;
    print(a);
    cout << " * ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("4096");
    b = BigNum("4");
    c = a / b;
    print(a);
    cout << " / ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;


    return 0;
}